

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * Fantasy_ReorderedEnum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *pcVar2;
  uint64_t uStack_40;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if ((ushort)(uVar1 >> 0x30) < 0x7279) {
    if ((uVar1 & 0x7fff000000000000) != 0x7278000000000000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,2,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uStack_40 = 10;
  }
  else if ((uVar1 & 0xffff000000000000) == 0x7279000000000000) {
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,2,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uStack_40 = 1;
  }
  else {
    if ((uVar1 & 0xffff000000000000) != 0x727a000000000000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,2,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uStack_40 = 9;
  }
  *value = uStack_40;
  *value_sign = 0;
  return pcVar2;
}

Assistant:

static const char *Fantasy_ReorderedEnum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x7279000000000000) { /* branch "ry" */
        if ((w & 0xffff000000000000) == 0x7278000000000000) { /* "rx" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 2, aggregate);
            if (buf != mark) {
                *value = UINT64_C(10), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "rx" */
            return unmatched;
        } /* "rx" */
    } else { /* branch "ry" */
        if ((w & 0xffff000000000000) == 0x727a000000000000) { /* "rz" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 2, aggregate);
            if (buf != mark) {
                *value = UINT64_C(9), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "rz" */
            if ((w & 0xffff000000000000) == 0x7279000000000000) { /* "ry" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 2, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(1), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "ry" */
                return unmatched;
            } /* "ry" */
        } /* "rz" */
    } /* branch "ry" */
    return buf;
}